

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

Z80Cond Z80::getz80cond(char **p)

{
  char *pcVar1;
  Z80Cond cc;
  char *pp;
  char **p_local;
  
  if ((Options::IsLR35902 & 1) == 0) {
    p_local._4_4_ = getz80cond_Z80(p);
  }
  else {
    pcVar1 = *p;
    p_local._4_4_ = getz80cond_Z80(p);
    if ((((p_local._4_4_ != Z80C_NZ) && (p_local._4_4_ != Z80C_Z)) && (p_local._4_4_ != Z80C_NC)) &&
       (p_local._4_4_ != Z80C_C)) {
      *p = pcVar1;
      p_local._4_4_ = Z80C_UNK;
    }
  }
  return p_local._4_4_;
}

Assistant:

static Z80Cond getz80cond(char*& p) {
		if (!Options::IsLR35902) return getz80cond_Z80(p);
		// Sharp LR35902 has only nz|z|nc|c condition variants of ret|jp|jr|call
		char * const pp = p;
		Z80Cond cc = getz80cond_Z80(p);
		switch (cc) {
		case Z80C_NZ:	case Z80C_Z:
		case Z80C_NC:	case Z80C_C:
			return cc;
		default:
			p = pp;			// restore source ptr
			return Z80C_UNK;
		}
	}